

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O0

void __thiscall
wasm::BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter>::visitIf
          (BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter> *this,If *curr)

{
  bool bVar1;
  BasicType local_1c;
  If *local_18;
  If *curr_local;
  BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter> *this_local;
  
  local_18 = curr;
  curr_local = (If *)this;
  emit(this,(Expression *)curr);
  visitPossibleBlockContents(this,local_18->ifTrue);
  if (local_18->ifFalse != (Expression *)0x0) {
    emitIfElse(this,local_18);
    visitPossibleBlockContents(this,local_18->ifFalse);
  }
  emitScopeEnd(this,(Expression *)local_18);
  local_1c = unreachable;
  bVar1 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression
                      .type,&local_1c);
  if (bVar1) {
    if (local_18->ifFalse == (Expression *)0x0) {
      __assert_fail("curr->ifFalse",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-stack.h"
                    ,0x18c,
                    "void wasm::BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter>::visitIf(If *) [SubType = wasm::BinaryenIRToBinaryWriter]"
                   );
    }
    emitUnreachable(this);
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitIf(If* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->ifTrue);

  if (curr->ifFalse) {
    emitIfElse(curr);
    visitPossibleBlockContents(curr->ifFalse);
  }

  emitScopeEnd(curr);
  if (curr->type == Type::unreachable) {
    // We already handled the case of the condition being unreachable in
    // `visit`.  Otherwise, we may still be unreachable, if we are an if-else
    // with both sides unreachable. Just like with blocks, we emit an extra
    // `unreachable` to work around potential type mismatches.
    assert(curr->ifFalse);
    emitUnreachable();
  }
}